

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O1

void Hacl_Bignum256_mul(uint64_t *a,uint64_t *b,uint64_t *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint64_t *res_i0;
  ulong uVar51;
  uint64_t out0_2;
  uint64_t out0;
  ulong uVar52;
  ulong uVar53;
  uint64_t out0_3;
  ulong uVar54;
  uint64_t out0_1;
  ulong uVar55;
  
  res[6] = 0;
  res[7] = 0;
  res[4] = 0;
  res[5] = 0;
  res[2] = 0;
  res[3] = 0;
  *res = 0;
  res[1] = 0;
  uVar55 = *b;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar55;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *a;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = SUB168(auVar1 * auVar17,8);
  *res = SUB168(auVar1 * auVar17,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar55;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = a[1];
  auVar34 = auVar2 * auVar18 + auVar34;
  uVar52 = auVar34._0_8_;
  uVar53 = uVar52 + res[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar34._8_8_ + (ulong)CARRY8(uVar52,res[1]);
  res[1] = uVar53;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar55;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = a[2];
  auVar35 = auVar3 * auVar19 + auVar35;
  uVar52 = auVar35._0_8_;
  uVar54 = uVar52 + res[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar35._8_8_ + (ulong)CARRY8(uVar52,res[2]);
  res[2] = uVar54;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar55;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = a[3];
  auVar36 = auVar4 * auVar20 + auVar36;
  uVar55 = auVar36._0_8_;
  uVar52 = uVar55 + res[3];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar52;
  uVar55 = auVar36._8_8_ + (ulong)CARRY8(uVar55,res[3]);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar55;
  res[3] = uVar52;
  res[4] = uVar55;
  uVar55 = b[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar55;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *a;
  uVar51 = SUB168(auVar5 * auVar21,8);
  uVar52 = SUB168(auVar5 * auVar21,0);
  res[1] = uVar52 + uVar53;
  uVar52 = (ulong)CARRY8(uVar52,uVar53);
  uVar53 = uVar51 + uVar54;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar55;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = a[1];
  auVar37[8] = CARRY8(uVar51,uVar54) || CARRY8(uVar53,uVar52);
  auVar37._0_8_ = uVar53 + uVar52;
  auVar37._9_7_ = 0;
  auVar37 = auVar6 * auVar22 + auVar37;
  uVar53 = auVar37._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar37._8_8_;
  res[2] = uVar53;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar55;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = a[2];
  auVar39 = auVar7 * auVar23 + auVar38 + auVar39;
  uVar54 = auVar39._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar39._8_8_;
  res[3] = uVar54;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar55;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = a[3];
  auVar41 = auVar8 * auVar24 + auVar40 + auVar41;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar41._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar41._8_8_;
  *(undefined1 (*) [16])(res + 4) = auVar41;
  uVar55 = b[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar55;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *a;
  uVar51 = SUB168(auVar9 * auVar25,8);
  uVar52 = SUB168(auVar9 * auVar25,0);
  res[2] = uVar52 + uVar53;
  uVar52 = (ulong)CARRY8(uVar52,uVar53);
  uVar53 = uVar51 + uVar54;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar55;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = a[1];
  auVar42[8] = CARRY8(uVar51,uVar54) || CARRY8(uVar53,uVar52);
  auVar42._0_8_ = uVar53 + uVar52;
  auVar42._9_7_ = 0;
  auVar42 = auVar10 * auVar26 + auVar42;
  uVar53 = auVar42._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar42._8_8_;
  res[3] = uVar53;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar55;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = a[2];
  auVar44 = auVar11 * auVar27 + auVar43 + auVar44;
  uVar54 = auVar44._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar44._8_8_;
  res[4] = uVar54;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar55;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = a[3];
  auVar46 = auVar12 * auVar28 + auVar45 + auVar46;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar46._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar46._8_8_;
  *(undefined1 (*) [16])(res + 5) = auVar46;
  uVar55 = b[3];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar55;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *a;
  uVar51 = SUB168(auVar13 * auVar29,8);
  uVar52 = SUB168(auVar13 * auVar29,0);
  res[3] = uVar52 + uVar53;
  uVar52 = (ulong)CARRY8(uVar52,uVar53);
  uVar53 = uVar51 + uVar54;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar55;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = a[1];
  auVar33[8] = CARRY8(uVar51,uVar54) || CARRY8(uVar53,uVar52);
  auVar33._0_8_ = uVar53 + uVar52;
  auVar33._9_7_ = 0;
  auVar33 = auVar14 * auVar30 + auVar33;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar33._8_8_;
  res[4] = auVar33._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar55;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = a[2];
  auVar48 = auVar15 * auVar31 + auVar47 + auVar48;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar48._8_8_;
  res[5] = auVar48._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar55;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = a[3];
  *(undefined1 (*) [16])(res + 6) = auVar16 * auVar32 + auVar49 + auVar50;
  return;
}

Assistant:

void Hacl_Bignum256_mul(uint64_t *a, uint64_t *b, uint64_t *res)
{
  memset(res, 0U, 8U * sizeof (uint64_t));
  KRML_MAYBE_FOR4(i0,
    0U,
    4U,
    1U,
    uint64_t bj = b[i0];
    uint64_t *res_j = res + i0;
    uint64_t c = 0ULL;
    {
      uint64_t a_i = a[4U * 0U];
      uint64_t *res_i0 = res_j + 4U * 0U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, bj, c, res_i0);
      uint64_t a_i0 = a[4U * 0U + 1U];
      uint64_t *res_i1 = res_j + 4U * 0U + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, bj, c, res_i1);
      uint64_t a_i1 = a[4U * 0U + 2U];
      uint64_t *res_i2 = res_j + 4U * 0U + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, bj, c, res_i2);
      uint64_t a_i2 = a[4U * 0U + 3U];
      uint64_t *res_i = res_j + 4U * 0U + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, bj, c, res_i);
    }
    uint64_t r = c;
    res[4U + i0] = r;);
}